

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O2

void __thiscall singleParticleSpectra::output_dNdSV(singleParticleSpectra *this)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  undefined1 auVar5 [16];
  ostream *poVar6;
  int i;
  long lVar7;
  int i_2;
  int j;
  long lVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double local_11c0;
  double local_11b8;
  double dStack_11b0;
  char *local_11a8 [4];
  ofstream output2_1;
  undefined8 auStack_1180 [2];
  uint auStack_1170 [122];
  ofstream output2;
  undefined8 auStack_f80 [2];
  uint auStack_f70 [122];
  ofstream output3;
  undefined8 auStack_d80 [2];
  uint auStack_d70 [122];
  ofstream output2_2;
  undefined8 auStack_b80 [2];
  uint auStack_b70 [122];
  ofstream output;
  undefined8 auStack_980 [2];
  uint auStack_970 [122];
  ostringstream filename3;
  ostringstream filename2_2;
  ostringstream filename2_1;
  ostringstream filename2;
  ostringstream filename;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename);
  poVar6 = std::operator<<((ostream *)&filename,(string *)this);
  poVar6 = std::operator<<(poVar6,"/check_");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->particle_monval);
  std::operator<<(poVar6,"_dNdtau.dat");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output,_output2,_S_out);
  std::__cxx11::string::~string((string *)&output2);
  for (lVar7 = 0; lVar7 < this->N_tau; lVar7 = lVar7 + 1) {
    pdVar2 = this->dNdtau_array;
    this->tau_array[lVar7] = this->tau_array[lVar7] / (pdVar2[lVar7] + 1.0);
    iVar1 = this->total_number_of_events;
    local_11c0 = pdVar2[lVar7] / (double)iVar1;
    pdVar2[lVar7] = local_11c0;
    local_11c0 = local_11c0 / (double)iVar1;
    if (local_11c0 < 0.0) {
      local_11c0 = sqrt(local_11c0);
    }
    else {
      local_11c0 = SQRT(local_11c0);
    }
    if (this->particle_monval == 0x14d) {
      this->dNdtau_array[lVar7] = this->dNdtau_array[lVar7] / this->reconst_branching_ratio;
      local_11c0 = local_11c0 / this->reconst_branching_ratio;
    }
    *(uint *)((long)auStack_970 + *(long *)(_output + -0x18)) =
         *(uint *)((long)auStack_970 + *(long *)(_output + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_980 + *(long *)(_output + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_980 + *(long *)(_output + -0x18)) = 8;
    poVar6 = std::ostream::_M_insert<double>(this->tau_array[lVar7]);
    std::operator<<(poVar6,"   ");
    poVar6 = std::ostream::_M_insert<double>(this->dNdtau_array[lVar7] / this->dtau);
    std::operator<<(poVar6,"   ");
    poVar6 = std::ostream::_M_insert<double>(local_11c0 / this->dtau);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::ofstream::close();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename2);
  poVar6 = std::operator<<((ostream *)&filename2,(string *)this);
  poVar6 = std::operator<<(poVar6,"/check_");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->particle_monval);
  std::operator<<(poVar6,"_dNdx.dat");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output2,_output2_1,_S_out);
  std::__cxx11::string::~string((string *)&output2_1);
  poVar6 = std::operator<<((ostream *)&output2,"# x  dN/dx  y  dN/dy  r  dN/dr");
  std::endl<char,std::char_traits<char>>(poVar6);
  for (lVar7 = 0; lVar7 < this->N_xpt; lVar7 = lVar7 + 1) {
    pdVar2 = this->dNdx1_array;
    this->xpt_array[lVar7] = this->xpt_array[lVar7] / (pdVar2[lVar7] + 1.0);
    pdVar3 = this->dNdx2_array;
    this->ypt_array[lVar7] = this->ypt_array[lVar7] / (pdVar3[lVar7] + 1.0);
    pdVar4 = this->dNdr_array;
    this->rpt_array[lVar7] = this->rpt_array[lVar7] / (pdVar4[lVar7] + 1.0);
    local_11c0 = (double)this->total_number_of_events;
    pdVar2[lVar7] = pdVar2[lVar7] / local_11c0;
    pdVar3[lVar7] = pdVar3[lVar7] / local_11c0;
    pdVar4[lVar7] = pdVar4[lVar7] / local_11c0;
    local_11c0 = pdVar2[lVar7] / local_11c0;
    if (local_11c0 < 0.0) {
      local_11c0 = sqrt(local_11c0);
    }
    else {
      local_11c0 = SQRT(local_11c0);
    }
    dVar9 = this->dNdx2_array[lVar7] / (double)this->total_number_of_events;
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar10 = this->dNdr_array[lVar7] / (double)this->total_number_of_events;
    if (dVar10 < 0.0) {
      dVar10 = sqrt(dVar10);
    }
    else {
      dVar10 = SQRT(dVar10);
    }
    auVar11._8_8_ = dVar9;
    auVar11._0_8_ = dVar10;
    if (this->particle_monval == 0x14d) {
      this->dNdx1_array[lVar7] = this->dNdx1_array[lVar7] / this->reconst_branching_ratio;
      this->dNdx2_array[lVar7] = this->dNdx2_array[lVar7] / this->reconst_branching_ratio;
      this->dNdr_array[lVar7] = this->dNdr_array[lVar7] / this->reconst_branching_ratio;
      dVar9 = this->reconst_branching_ratio;
      local_11c0 = local_11c0 / dVar9;
      auVar5._8_8_ = dVar9;
      auVar5._0_8_ = dVar9;
      auVar11 = divpd(auVar11,auVar5);
    }
    *(uint *)((long)auStack_f70 + *(long *)(_output2 + -0x18)) =
         *(uint *)((long)auStack_f70 + *(long *)(_output2 + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_f80 + *(long *)(_output2 + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_f80 + *(long *)(_output2 + -0x18)) = 8;
    poVar6 = std::ostream::_M_insert<double>(this->xpt_array[lVar7]);
    std::operator<<(poVar6,"   ");
    poVar6 = std::ostream::_M_insert<double>(this->dNdx1_array[lVar7] / this->dspatial_x);
    std::operator<<(poVar6,"   ");
    poVar6 = std::ostream::_M_insert<double>(local_11c0 / this->dspatial_x);
    std::operator<<(poVar6,"   ");
    poVar6 = std::ostream::_M_insert<double>(this->ypt_array[lVar7]);
    std::operator<<(poVar6,"   ");
    poVar6 = std::ostream::_M_insert<double>(this->dNdx2_array[lVar7] / this->dspatial_x);
    std::operator<<(poVar6,"   ");
    dStack_11b0 = auVar11._8_8_;
    poVar6 = std::ostream::_M_insert<double>(dStack_11b0 / this->dspatial_x);
    std::operator<<(poVar6,"   ");
    poVar6 = std::ostream::_M_insert<double>(this->rpt_array[lVar7]);
    std::operator<<(poVar6,"   ");
    poVar6 = std::ostream::_M_insert<double>(this->dNdr_array[lVar7] / this->dspatial_r);
    std::operator<<(poVar6,"   ");
    local_11b8 = auVar11._0_8_;
    poVar6 = std::ostream::_M_insert<double>(local_11b8 / this->dspatial_r);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::ofstream::close();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename2_1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename2_2);
  poVar6 = std::operator<<((ostream *)&filename2_1,(string *)this);
  poVar6 = std::operator<<(poVar6,"/check_");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->particle_monval);
  std::operator<<(poVar6,"_dNdtaudx1.dat");
  poVar6 = std::operator<<((ostream *)&filename2_2,(string *)this);
  poVar6 = std::operator<<(poVar6,"/check_");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->particle_monval);
  std::operator<<(poVar6,"_dNdtaudx2.dat");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output2_1,_output2_2,_S_out);
  std::__cxx11::string::~string((string *)&output2_2);
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output2_2,_output3,_S_out);
  std::__cxx11::string::~string((string *)&output3);
  for (lVar7 = 0; lVar7 < this->N_tau; lVar7 = lVar7 + 1) {
    for (lVar8 = 0; lVar8 < this->N_xpt; lVar8 = lVar8 + 1) {
      pdVar2 = this->dNdtaudx1_array[lVar7];
      iVar1 = this->total_number_of_events;
      pdVar2[lVar8] = pdVar2[lVar8] / (double)iVar1;
      pdVar3 = this->dNdtaudx2_array[lVar7];
      pdVar3[lVar8] = pdVar3[lVar8] / (double)iVar1;
      if (this->particle_monval == 0x14d) {
        pdVar2[lVar8] = pdVar2[lVar8] / this->reconst_branching_ratio;
        pdVar3[lVar8] = pdVar3[lVar8] / this->reconst_branching_ratio;
      }
      *(uint *)((long)auStack_1170 + *(long *)(_output2_1 + -0x18)) =
           *(uint *)((long)auStack_1170 + *(long *)(_output2_1 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_1180 + *(long *)(_output2_1 + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_1180 + *(long *)(_output2_1 + -0x18)) = 8;
      poVar6 = std::ostream::_M_insert<double>((pdVar2[lVar8] / this->dspatial_x) / this->dtau);
      std::operator<<(poVar6,"   ");
      *(uint *)((long)auStack_b70 + *(long *)(_output2_2 + -0x18)) =
           *(uint *)((long)auStack_b70 + *(long *)(_output2_2 + -0x18)) & 0xfffffefb | 0x100;
      *(undefined8 *)((long)auStack_b80 + *(long *)(_output2_2 + -0x18) + 8) = 0x12;
      *(undefined8 *)((long)auStack_b80 + *(long *)(_output2_2 + -0x18)) = 8;
      poVar6 = std::ostream::_M_insert<double>
                         ((this->dNdtaudx2_array[lVar7][lVar8] / this->dspatial_x) / this->dtau);
      std::operator<<(poVar6,"   ");
    }
    std::endl<char,std::char_traits<char>>((ostream *)&output2_1);
    std::endl<char,std::char_traits<char>>((ostream *)&output2_2);
  }
  std::ofstream::close();
  std::ofstream::close();
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&filename3);
  poVar6 = std::operator<<((ostream *)&filename3,(string *)this);
  poVar6 = std::operator<<(poVar6,"/check_");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,this->particle_monval);
  std::operator<<(poVar6,"_dNdetas.dat");
  std::__cxx11::stringbuf::str();
  std::ofstream::ofstream(&output3,local_11a8[0],_S_out);
  std::__cxx11::string::~string((string *)local_11a8);
  for (lVar7 = 0; lVar7 < this->N_eta_s; lVar7 = lVar7 + 1) {
    pdVar2 = this->dNdetas_array;
    this->eta_s_array[lVar7] = this->eta_s_array[lVar7] / (pdVar2[lVar7] + 1.0);
    iVar1 = this->total_number_of_events;
    local_11c0 = pdVar2[lVar7] / (double)iVar1;
    pdVar2[lVar7] = local_11c0;
    local_11c0 = local_11c0 / (double)iVar1;
    if (local_11c0 < 0.0) {
      local_11c0 = sqrt(local_11c0);
    }
    else {
      local_11c0 = SQRT(local_11c0);
    }
    if (this->particle_monval == 0x14d) {
      this->dNdetas_array[lVar7] = this->dNdetas_array[lVar7] / this->reconst_branching_ratio;
      local_11c0 = local_11c0 / this->reconst_branching_ratio;
    }
    *(uint *)((long)auStack_d70 + *(long *)(_output3 + -0x18)) =
         *(uint *)((long)auStack_d70 + *(long *)(_output3 + -0x18)) & 0xfffffefb | 0x100;
    *(undefined8 *)((long)auStack_d80 + *(long *)(_output3 + -0x18) + 8) = 0x12;
    *(undefined8 *)((long)auStack_d80 + *(long *)(_output3 + -0x18)) = 8;
    poVar6 = std::ostream::_M_insert<double>(this->eta_s_array[lVar7]);
    std::operator<<(poVar6,"   ");
    poVar6 = std::ostream::_M_insert<double>(this->dNdetas_array[lVar7] / this->deta_s);
    std::operator<<(poVar6,"   ");
    poVar6 = std::ostream::_M_insert<double>(local_11c0 / this->deta_s);
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  std::ofstream::close();
  std::ofstream::~ofstream(&output3);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename3);
  std::ofstream::~ofstream(&output2_2);
  std::ofstream::~ofstream(&output2_1);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename2_2);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename2_1);
  std::ofstream::~ofstream(&output2);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename2);
  std::ofstream::~ofstream(&output);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&filename);
  return;
}

Assistant:

void singleParticleSpectra::output_dNdSV() {
    // first dN/dtau
    ostringstream filename;
    filename << path_ << "/check_" << particle_monval << "_dNdtau.dat";
    ofstream output(filename.str().c_str());
    for (int i = 0; i < N_tau; i++) {
        tau_array[i] = tau_array[i] / (dNdtau_array[i] + 1.);
        dNdtau_array[i] = dNdtau_array[i] / total_number_of_events;
        double dNdtau_err = sqrt(dNdtau_array[i] / total_number_of_events);
        if (particle_monval == 333) {
            dNdtau_array[i] = dNdtau_array[i] / reconst_branching_ratio;
            dNdtau_err = dNdtau_err / reconst_branching_ratio;
        }
        output << scientific << setw(18) << setprecision(8) << tau_array[i]
               << "   " << dNdtau_array[i] / dtau << "   " << dNdtau_err / dtau
               << endl;
    }
    output.close();

    // second dN/dx
    ostringstream filename2;
    filename2 << path_ << "/check_" << particle_monval << "_dNdx.dat";
    ofstream output2(filename2.str().c_str());
    output2 << "# x  dN/dx  y  dN/dy  r  dN/dr" << endl;
    for (int i = 0; i < N_xpt; i++) {
        xpt_array[i] = xpt_array[i] / (dNdx1_array[i] + 1.);
        ypt_array[i] = ypt_array[i] / (dNdx2_array[i] + 1.);
        rpt_array[i] = rpt_array[i] / (dNdr_array[i] + 1.);
        dNdx1_array[i] = dNdx1_array[i] / total_number_of_events;
        dNdx2_array[i] = dNdx2_array[i] / total_number_of_events;
        dNdr_array[i] = dNdr_array[i] / total_number_of_events;
        double dNdx1_err = sqrt(dNdx1_array[i] / total_number_of_events);
        double dNdx2_err = sqrt(dNdx2_array[i] / total_number_of_events);
        double dNdr_err = sqrt(dNdr_array[i] / total_number_of_events);
        if (particle_monval == 333) {
            dNdx1_array[i] = dNdx1_array[i] / reconst_branching_ratio;
            dNdx2_array[i] = dNdx2_array[i] / reconst_branching_ratio;
            dNdr_array[i] = dNdr_array[i] / reconst_branching_ratio;
            dNdx1_err = dNdx1_err / reconst_branching_ratio;
            dNdx2_err = dNdx2_err / reconst_branching_ratio;
            dNdr_err = dNdr_err / reconst_branching_ratio;
        }
        output2 << scientific << setw(18) << setprecision(8) << xpt_array[i]
                << "   " << dNdx1_array[i] / dspatial_x << "   "
                << dNdx1_err / dspatial_x << "   " << ypt_array[i] << "   "
                << dNdx2_array[i] / dspatial_x << "   "
                << dNdx2_err / dspatial_x << "   " << rpt_array[i] << "   "
                << dNdr_array[i] / dspatial_r << "   " << dNdr_err / dspatial_r
                << endl;
    }
    output2.close();

    // dN/(dtau dx)
    ostringstream filename2_1, filename2_2;
    filename2_1 << path_ << "/check_" << particle_monval << "_dNdtaudx1.dat";
    filename2_2 << path_ << "/check_" << particle_monval << "_dNdtaudx2.dat";
    ofstream output2_1(filename2_1.str().c_str());
    ofstream output2_2(filename2_2.str().c_str());
    for (int i = 0; i < N_tau; i++) {
        for (int j = 0; j < N_xpt; j++) {
            dNdtaudx1_array[i][j] =
                (dNdtaudx1_array[i][j] / total_number_of_events);
            dNdtaudx2_array[i][j] =
                (dNdtaudx2_array[i][j] / total_number_of_events);
            if (particle_monval == 333) {
                dNdtaudx1_array[i][j] =
                    (dNdtaudx1_array[i][j] / reconst_branching_ratio);
                dNdtaudx2_array[i][j] =
                    (dNdtaudx2_array[i][j] / reconst_branching_ratio);
            }
            output2_1 << scientific << setw(18) << setprecision(8)
                      << dNdtaudx1_array[i][j] / dspatial_x / dtau << "   ";
            output2_2 << scientific << setw(18) << setprecision(8)
                      << dNdtaudx2_array[i][j] / dspatial_x / dtau << "   ";
        }
        output2_1 << endl;
        output2_2 << endl;
    }
    output2_1.close();
    output2_2.close();

    // third dN/detas
    ostringstream filename3;
    filename3 << path_ << "/check_" << particle_monval << "_dNdetas.dat";
    ofstream output3(filename3.str().c_str());
    for (int i = 0; i < N_eta_s; i++) {
        eta_s_array[i] = eta_s_array[i] / (dNdetas_array[i] + 1.);
        dNdetas_array[i] = dNdetas_array[i] / total_number_of_events;
        double dNdetas_err = sqrt(dNdetas_array[i] / total_number_of_events);
        if (particle_monval == 333) {
            dNdetas_array[i] = dNdetas_array[i] / reconst_branching_ratio;
            dNdetas_err = dNdetas_err / reconst_branching_ratio;
        }
        output3 << scientific << setw(18) << setprecision(8) << eta_s_array[i]
                << "   " << dNdetas_array[i] / deta_s << "   "
                << dNdetas_err / deta_s << endl;
    }
    output3.close();
}